

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_geom_buf.cxx
# Opt level: O3

void __thiscall xray_re::xr_vbuf::make_signature(xr_vbuf *this)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  
  bVar3 = this->m_points != (fvector3 *)0x0;
  uVar2 = (uint)bVar3;
  uVar1 = (uint)bVar3;
  this->m_signature = uVar1;
  if (this->m_normals != (fvector3 *)0x0) {
    uVar2 = uVar1 | 2;
    this->m_signature = uVar2;
  }
  if (this->m_texcoords != (fvector2 *)0x0) {
    uVar2 = uVar2 | 4;
    this->m_signature = uVar2;
  }
  if (this->m_lightmaps != (fvector2 *)0x0) {
    uVar2 = uVar2 | 8;
    this->m_signature = uVar2;
  }
  if (this->m_influences != (finfluence *)0x0) {
    uVar2 = uVar2 | 0x10;
    this->m_signature = uVar2;
  }
  if (this->m_colors != (fcolor *)0x0) {
    this->m_signature = uVar2 | 0x20;
  }
  return;
}

Assistant:

void xr_vbuf::make_signature()
{
	m_signature = 0;
	if (m_points)
		m_signature |= S_POINTS;
	if (m_normals)
		m_signature |= S_NORMALS;
	if (m_texcoords)
		m_signature |= S_TEXCOORDS;
	if (m_lightmaps)
		m_signature |= S_LIGHTMAPS;
	if (m_influences)
		m_signature |= S_INFLUENCES;
	if (m_colors)
		m_signature |= S_COLORS;
}